

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

void __thiscall
Js::ES5HeapArgumentsObject::DisconnectFormalFromNamedArgument
          (ES5HeapArgumentsObject *this,uint32 index)

{
  BVSparse<Memory::Recycler> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  
  if (((*(uint *)&(this->super_HeapArgumentsObject).field_0x20 & 0x7fffffff) <= index) ||
     ((this->super_HeapArgumentsObject).formalCount <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x2b7,"(this->IsFormalArgument(index))",
                                "SetAccessorsForFormal: called for non-formal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = (this->super_HeapArgumentsObject).deletedArgs.ptr;
  if (this_00 != (BVSparse<Memory::Recycler> *)0x0) {
    BVar3 = BVSparse<Memory::Recycler>::Test(this_00,index);
    if (BVar3 != '\0') {
      return;
    }
  }
  HeapArgumentsObject::DeleteItemAt(&this->super_HeapArgumentsObject,index);
  return;
}

Assistant:

void ES5HeapArgumentsObject::DisconnectFormalFromNamedArgument(uint32 index)
    {
        AssertMsg(this->IsFormalArgument(index), "SetAccessorsForFormal: called for non-formal");

        if (!IsFormalDisconnectedFromNamedArgument(index))
        {
            __super::DeleteItemAt(index);
        }
    }